

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O1

void decodeModrm(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  ulong uVar1;
  UIntPtr UVar2;
  uint uVar3;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  uVar1 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar1 != 0) && (uVar1 < (pMyDisasm->Reserved_).EIP_ + 2)) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return;
  }
  UVar2 = (pMyDisasm->Reserved_).EIP_;
  uVar3 = (uint)(*(byte *)(UVar2 + 1) >> 6);
  (pMyDisasm->Reserved_).MOD_ = uVar3;
  (pMyDisasm->Reserved_).RM_ = *(byte *)(UVar2 + 1) & 7;
  (*(code *)(&DAT_00144934 + *(int *)(&DAT_00144934 + (ulong)uVar3 * 4)))();
  return;
}

Assistant:

void __bea_callspec__ decodeModrm(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
  UInt8* modrm;
  GV.DECALAGE_EIP = 0;
  if (!Security(2, pMyDisasm)) return;
  modrm = (UInt8*) (GV.EIP_ + 1);
  GV.MOD_ = (*modrm >> 6) & 0x3;
  GV.RM_  = *modrm & 0x7;
  switch(GV.MOD_) {
    case 0:
      ModRM_0[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 1:
      GV.DECALAGE_EIP++;
      if (!Security(3, pMyDisasm)) return;
      ModRM_1[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 2:
      if (GV.AddressSize >= 32) {
        GV.DECALAGE_EIP += 4;
        if (!Security(6, pMyDisasm)) return;
      }
      else {
        GV.DECALAGE_EIP += 2;
        if (!Security(4, pMyDisasm)) return;
      }
      ModRM_2[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 3:
      ModRM_3[GV.RM_](pMyOperand, pMyDisasm);
  }
}